

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O2

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,double t)

{
  MatrixXd *this_00;
  VectorXd *pVVar1;
  VectorXd *pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Scalar SVar6;
  CoeffReturnType CVar7;
  Scalar *pSVar8;
  Scalar *pSVar9;
  Scalar *pSVar10;
  ulong row;
  ulong uVar11;
  Index j;
  long lVar12;
  long lVar13;
  MatrixXd *this_01;
  long lVar14;
  Index r;
  long lVar15;
  ulong uVar16;
  Index IVar17;
  ulong col;
  double local_a8;
  double local_90;
  long local_48;
  
  this_01 = &this->m_values;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)this_01);
  this->m_first_nonzero_pole = (span + 1) - this->m_degree;
  this_00 = &this->m_ndu;
  pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,0,0);
  *pSVar8 = 1.0;
  pVVar1 = &this->m_left;
  pVVar2 = &this->m_right;
  lVar12 = 0;
  while (lVar13 = this->m_degree, lVar12 < lVar13) {
    CVar7 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)knots,span - lVar12);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,lVar12)
    ;
    *pSVar9 = t - CVar7;
    CVar7 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)knots,span + 1 + lVar12);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,lVar12)
    ;
    *pSVar9 = CVar7 - t;
    lVar13 = lVar12 + 1;
    local_90 = 0.0;
    lVar15 = 0;
    for (lVar14 = lVar12; lVar14 != -1; lVar14 = lVar14 + -1) {
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,
                          lVar15);
      dVar3 = *pSVar9;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,
                          lVar14);
      dVar4 = *pSVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                          lVar13,lVar15);
      *pSVar8 = dVar3 + dVar4;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                          lVar15,lVar12);
      dVar3 = *pSVar8;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                          lVar13,lVar15);
      dVar4 = *pSVar8;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,
                          lVar15);
      dVar5 = *pSVar9;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                          lVar15,lVar13);
      *pSVar8 = dVar5 * (dVar3 / dVar4) + local_90;
      pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,
                          lVar14);
      local_90 = (dVar3 / dVar4) * *pSVar9;
      lVar15 = lVar15 + 1;
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                        lVar13,lVar13);
    *pSVar8 = local_90;
    lVar12 = lVar13;
  }
  for (lVar12 = 0; lVar12 <= lVar13; lVar12 = lVar12 + 1) {
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00,
                        lVar12,lVar13);
    SVar6 = *pSVar8;
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_01,0,
                        lVar12);
    *pSVar8 = SVar6;
    lVar13 = this->m_degree;
  }
  pVVar1 = &this->m_a;
  pVVar2 = &this->m_b;
  for (col = 0; (long)col <= lVar13; col = col + 1) {
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,0);
    *pSVar9 = 1.0;
    local_48 = 0;
    uVar11 = 0;
    row = 1;
    while( true ) {
      uVar16 = uVar11;
      if (uVar11 < col) {
        uVar16 = col;
      }
      if (this->m_order < (long)row) break;
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_01,
                          row,col);
      IVar17 = this->m_degree;
      lVar12 = IVar17 - row;
      if (row <= col) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,0);
        dVar3 = *pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar12 + 1,col - row);
        dVar4 = *pSVar10;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,0);
        *pSVar9 = dVar3 / dVar4;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,0);
        dVar3 = *pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,col - row,lVar12);
        *pSVar8 = dVar3 * *pSVar10;
        IVar17 = this->m_degree;
      }
      lVar14 = lVar12 + 1;
      lVar15 = uVar16 + local_48;
      lVar13 = row - col;
      if (row - 1 <= col) {
        lVar13 = 1;
      }
      uVar16 = (IVar17 - col) + 1;
      if ((long)col <= lVar14) {
        uVar16 = row;
      }
      for (; lVar13 < (long)uVar16; lVar13 = lVar13 + 1) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,
                            lVar13);
        dVar3 = *pSVar9;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,
                            lVar13 + -1);
        dVar4 = *pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar14,lVar15);
        dVar5 = *pSVar10;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,
                            lVar13);
        *pSVar9 = (dVar3 - dVar4) / dVar5;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,
                            lVar13);
        dVar3 = *pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar15,lVar12);
        *pSVar8 = dVar3 * *pSVar10 + *pSVar8;
        lVar15 = lVar15 + 1;
      }
      if ((long)col <= lVar12) {
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar1,
                            row - 1);
        local_a8 = -*pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,lVar14,col);
        dVar3 = *pSVar10;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,row
                           );
        *pSVar9 = local_a8 / dVar3;
        pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)pVVar2,row
                           );
        dVar3 = *pSVar9;
        pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_00
                             ,col,lVar12);
        *pSVar8 = dVar3 * *pSVar10 + *pSVar8;
      }
      std::swap<Eigen::Matrix<double,_1,1,0,_1,1>>(pVVar1,pVVar2);
      row = row + 1;
      uVar11 = uVar11 + 1;
      local_48 = local_48 + -1;
    }
    lVar13 = this->m_degree;
  }
  lVar14 = lVar13;
  for (lVar12 = 1; lVar12 <= this->m_order; lVar12 = lVar12 + 1) {
    for (lVar15 = 0; lVar15 <= lVar13; lVar15 = lVar15 + 1) {
      pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)this_01,
                          lVar12,lVar15);
      *pSVar8 = *pSVar8 * (double)lVar14;
      lVar13 = this->m_degree;
    }
    lVar14 = lVar14 * (lVar13 - lVar12);
  }
  return;
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, const double t)
    {
        clear_values();

        m_first_nonzero_pole = span - degree() + 1;

        // compute B-Spline shape

        ndu(0, 0) = 1.0;

        for (Index j = 0; j < degree(); j++) {
            m_left[j] = t - knots[span - j];
            m_right[j] = knots[span + j + 1] - t;

            double saved = 0.0;

            for (Index r = 0; r <= j; r++) {
                ndu(j + 1, r) = m_right[r] + m_left[j - r];

                double temp = ndu(r, j) / ndu(j + 1, r);

                ndu(r, j + 1) = saved + m_right[r] * temp;

                saved = m_left[j - r] * temp;
            }

            ndu(j + 1, j + 1) = saved;
        }

        for (Index j = 0; j < nb_nonzero_poles(); j++) {
            value(0, j) = ndu(j, degree());
        }

        auto& a = m_a;
        auto& b = m_b;

        for (Index r = 0; r < nb_nonzero_poles(); r++) {
            a[0] = 1.0;

            for (Index k = 1; k < nb_shapes(); k++) {
                double& v = value(k, r);

                Index rk = r - k;
                Index pk = degree() - k;

                if (r >= k) {
                    b[0] = a[0] / ndu(pk + 1, rk);
                    v = b[0] * ndu(rk, pk);
                }

                Index j1 = r >= k - 1 ? 1 : k - r;
                Index j2 = r <= pk + 1 ? k : nb_nonzero_poles() - r;

                for (Index j = j1; j < j2; j++) {
                    b[j] = (a[j] - a[j - 1]) / ndu(pk + 1, rk + j);
                    v += b[j] * ndu(rk + j, pk);
                }

                if (r <= pk) {
                    b[k] = -a[k - 1] / ndu(pk + 1, r);
                    v += b[k] * ndu(r, pk);
                }

                std::swap(a, b);
            }
        }

        Index s = degree();

        for (Index k = 1; k < nb_shapes(); k++) {
            for (Index j = 0; j < nb_nonzero_poles(); j++) {
                value(k, j) *= s;
            }
            s *= degree() - k;
        }
    }